

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_op_gobble_right(char *expr,int *pos,matd_t *acc,matd_t **garb,int *garbpos)

{
  matd_t *res_1;
  matd_t *res;
  int *garbpos_local;
  matd_t **garb_local;
  matd_t *acc_local;
  int *pos_local;
  char *expr_local;
  
  garb_local = (matd_t **)acc;
  while( true ) {
    while( true ) {
      if (expr[*pos] == '\0') {
        return (matd_t *)garb_local;
      }
      if (expr[*pos] != '\'') break;
      if (garb_local == (matd_t **)0x0) {
        __assert_fail("acc != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x22e,
                      "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)"
                     );
      }
      garb_local = (matd_t **)matd_transpose((matd_t *)garb_local);
      garb[*garbpos] = (matd_t *)garb_local;
      *garbpos = *garbpos + 1;
      *pos = *pos + 1;
    }
    if (expr[*pos] != '^') {
      return (matd_t *)garb_local;
    }
    if (garb_local == (matd_t **)0x0) {
      __assert_fail("acc != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                    ,0x23a,
                    "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)")
      ;
    }
    if (expr[*pos + 1] != '-') break;
    if (expr[*pos + 2] != '1') {
      __assert_fail("expr[*pos+2] == \'1\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                    ,0x23c,
                    "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)")
      ;
    }
    garb_local = (matd_t **)matd_inverse((matd_t *)garb_local);
    garb[*garbpos] = (matd_t *)garb_local;
    *garbpos = *garbpos + 1;
    *pos = *pos + 3;
  }
  __assert_fail("expr[*pos+1] == \'-\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x23b,
                "matd_t *matd_op_gobble_right(const char *, int *, matd_t *, matd_t **, int *)");
}

Assistant:

static inline matd_t *matd_op_gobble_right(const char *expr, int *pos, matd_t *acc, matd_t **garb, int *garbpos)
{
    while (expr[*pos] != 0) {

        switch (expr[*pos]) {

            case '\'': {
                assert(acc != NULL); // either a syntax error or a math op failed, producing null
                matd_t *res = matd_transpose(acc);
                garb[*garbpos] = res;
                (*garbpos)++;
                acc = res;

                (*pos)++;
                break;
            }

                // handle inverse ^-1. No other exponents are allowed.
            case '^': {
                assert(acc != NULL);
                assert(expr[*pos+1] == '-');
                assert(expr[*pos+2] == '1');

                matd_t *res = matd_inverse(acc);
                garb[*garbpos] = res;
                (*garbpos)++;
                acc = res;

                (*pos)+=3;
                break;
            }

            default:
                return acc;
        }
    }

    return acc;
}